

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

void getProjectGroupFilesRec
               (Output *output,ProjectGroup *group,
               vector<FileInfo,_std::allocator<FileInfo>_> *files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  char *path;
  pointer puVar4;
  bool bVar5;
  pointer pbVar6;
  unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> *child;
  pointer puVar7;
  uint64_t mtime;
  uint64_t size;
  string buf;
  ProjectGroup *local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  FileInfo local_60;
  
  pbVar2 = (group->files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = group;
  for (pbVar6 = (group->files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
    bVar5 = getFileAttributes((pbVar6->_M_dataplus)._M_p,(uint64_t *)local_a0._M_pod_data,
                              (uint64_t *)local_80._M_pod_data);
    if (bVar5) {
      paVar1 = &local_60.path.field_2;
      pcVar3 = (pbVar6->_M_dataplus)._M_p;
      local_60.path._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + pbVar6->_M_string_length);
      local_60.timeStamp = (uint64_t)local_a0._M_unused._0_8_;
      local_60.fileSize = (uint64_t)local_80._M_unused._0_8_;
      std::vector<FileInfo,_std::allocator<FileInfo>_>::emplace_back<FileInfo>(files,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.path._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.path._M_dataplus._M_p);
      }
    }
    else {
      (*output->_vptr_Output[4])
                (output,"Error reading metadata for file %s\n",(pbVar6->_M_dataplus)._M_p);
    }
  }
  pbVar6 = (local_a8->paths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_a8->paths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar2) {
    paVar1 = &local_60.path.field_2;
    do {
      local_60.path._M_string_length = 0;
      local_60.path.field_2._M_local_buf[0] = '\0';
      path = (pbVar6->_M_dataplus)._M_p;
      local_a0._8_8_ = 0;
      local_60.path._M_dataplus._M_p = (pointer)paVar1;
      local_a0._M_unused._M_object = operator_new(0x20);
      local_80._M_unused._M_object = &local_a8;
      *(undefined8 *)local_a0._M_unused._0_8_ = local_80._M_unused._M_object;
      *(FileInfo **)((long)local_a0._M_unused._0_8_ + 8) = &local_60;
      *(pointer *)((long)local_a0._M_unused._0_8_ + 0x10) = pbVar6;
      *(vector<FileInfo,_std::allocator<FileInfo>_> **)((long)local_a0._M_unused._0_8_ + 0x18) =
           files;
      local_88 = std::
                 _Function_handler<void_(const_char_*,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:316:51)>
                 ::_M_invoke;
      local_90 = std::
                 _Function_handler<void_(const_char_*,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:316:51)>
                 ::_M_manager;
      local_80._8_8_ = 0;
      local_68 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:322:7)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:322:7)>
                 ::_M_manager;
      bVar5 = traverseDirectory(path,(function<void_(const_char_*,_unsigned_long,_unsigned_long)> *)
                                     &local_a0,(function<bool_(const_char_*)> *)&local_80);
      if (local_70 != (code *)0x0) {
        (*local_70)(&local_80,&local_80,__destroy_functor);
      }
      if (local_90 != (code *)0x0) {
        (*local_90)(&local_a0,&local_a0,__destroy_functor);
      }
      if (!bVar5) {
        (*output->_vptr_Output[4])(output,"Error reading folder %s\n",(pbVar6->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.path._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.path._M_dataplus._M_p);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar2);
  }
  puVar4 = (local_a8->groups).
           super__Vector_base<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (local_a8->groups).
                super__Vector_base<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1) {
    getProjectGroupFilesRec
              (output,(puVar7->_M_t).
                      super___uniq_ptr_impl<ProjectGroup,_std::default_delete<ProjectGroup>_>._M_t.
                      super__Tuple_impl<0UL,_ProjectGroup_*,_std::default_delete<ProjectGroup>_>.
                      super__Head_base<0UL,_ProjectGroup_*,_false>._M_head_impl,files);
  }
  return;
}

Assistant:

static void getProjectGroupFilesRec(Output* output, ProjectGroup* group, std::vector<FileInfo>& files)
{
	for (auto& path: group->files)
	{
		uint64_t mtime, size;

		if (getFileAttributes(path.c_str(), &mtime, &size))
			files.push_back({ path, mtime, size });
		else
			output->error("Error reading metadata for file %s\n", path.c_str());
	}

	for (auto& folder: group->paths)
	{
		std::string buf;

		bool result = traverseDirectory(folder.c_str(), [&](const char* path, uint64_t mtime, uint64_t size) {
			if (isFileAcceptable(group, path))
			{
				joinPaths(buf, folder.c_str(), path);
				files.push_back({ buf, mtime, size });
			}
			}, [&](const char* path) {
				return isDirectoryAcceptable(group, path);
			});

		if (!result) output->error("Error reading folder %s\n", folder.c_str());
	}

	for (auto& child: group->groups)
		getProjectGroupFilesRec(output, child.get(), files);
}